

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidLayerNormalizationNoNormalizedShape(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *pRVar2;
  uint uVar3;
  uint uVar4;
  Rep *pRVar5;
  ulong uVar6;
  ConvolutionLayerParams *pCVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  LayerNormalizationLayerParams *pLVar16;
  WeightParams *pWVar17;
  float *pfVar18;
  ostream *poVar19;
  string *psVar20;
  long lVar21;
  undefined8 *puVar22;
  int iVar23;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar24;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  uint32_t size;
  uint uVar25;
  Arena *pAVar26;
  Model m;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar5 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001bbab9:
    pRVar24 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar23 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar23) goto LAB_001bbab9;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar5->elements[iVar23];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"input",puVar22);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar26);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 3;
  uVar25 = uVar3 + 1;
  (pAVar10->shape_).current_size_ = uVar25;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar25 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar25] = 5;
  uVar25 = uVar3 + 2;
  (pAVar10->shape_).current_size_ = uVar25;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar25 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar25] = 2;
  pRVar1->current_size_ = uVar3 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar5 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001bbc25:
    pRVar24 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar23 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar23) goto LAB_001bbc25;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar5->elements[iVar23];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"output",puVar22);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar6 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar26);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pRVar1 = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar3] = 3;
  uVar25 = uVar3 + 1;
  (pAVar10->shape_).current_size_ = uVar25;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar25 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar25] = 5;
  uVar25 = uVar3 + 2;
  (pAVar10->shape_).current_size_ = uVar25;
  uVar4 = (pAVar10->shape_).total_size_;
  if (uVar25 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar11[uVar25] = 2;
  pRVar1->current_size_ = uVar3 + 3;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar26);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar5 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001bbdaa:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar13);
  }
  else {
    iVar23 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar5->allocated_size <= iVar23) goto LAB_001bbdaa;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar23 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar5->elements[iVar23];
  }
  pRVar5 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001bbde2:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar23 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar23) goto LAB_001bbde2;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar5->elements[iVar23];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3cb973);
  pRVar5 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001bbe32:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar23 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar23) goto LAB_001bbe32;
    (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar5->elements[iVar23];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3dece7);
  if (pNVar13->_oneof_case_[0] != 0x546) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0x546;
    uVar6 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pLVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::LayerNormalizationLayerParams>(pAVar26);
    (pNVar13->layer_).layernormalization_ = pLVar16;
  }
  pCVar7 = (pNVar13->layer_).convolution_;
  lVar21._0_4_ = (pCVar7->stride_).current_size_;
  lVar21._4_4_ = (pCVar7->stride_).total_size_;
  if (lVar21 == 0) {
    uVar6 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar26);
    *(WeightParams **)&pCVar7->stride_ = pWVar17;
  }
  lVar21 = *(long *)&pCVar7->stride_;
  pRVar2 = (RepeatedField<float> *)(lVar21 + 0x10);
  uVar3 = *(uint *)(lVar21 + 0x10);
  if (uVar3 == *(uint *)(lVar21 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,*(uint *)(lVar21 + 0x14) + 1);
  }
  pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
  pfVar18[uVar3] = 1.0;
  pRVar2->current_size_ = uVar3 + 1;
  if ((pCVar7->stride_).arena_or_elements_ == (void *)0x0) {
    uVar6 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar6 & 0xfffffffffffffffc);
    if ((uVar6 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                        (pAVar26);
    (pCVar7->stride_).arena_or_elements_ = pWVar17;
  }
  pvVar15 = (pCVar7->stride_).arena_or_elements_;
  pRVar2 = (RepeatedField<float> *)((long)pvVar15 + 0x10);
  uVar3 = *(uint *)((long)pvVar15 + 0x10);
  if (uVar3 == *(uint *)((long)pvVar15 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar2,*(uint *)((long)pvVar15 + 0x14) + 1);
  }
  pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar2);
  pfVar18[uVar3] = 0.0;
  pRVar2->current_size_ = uVar3 + 1;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  else {
    psVar20 = CoreML::Result::message_abi_cxx11_(&local_48);
    iVar23 = 0;
    lVar21 = std::__cxx11::string::find((char *)psVar20,0x3b9098,0);
    if (lVar21 != -1) goto LAB_001bc0e6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x16bd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,"res.message().find(\"Normalized shape\") != std::string::npos",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  std::ostream::put((char)poVar19);
  iVar23 = 1;
  std::ostream::flush();
LAB_001bc0e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return iVar23;
}

Assistant:

int testInvalidLayerNormalizationNoNormalizedShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(0.0);

    // not specifying the value for normalized shape
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Normalized shape") != std::string::npos);

    return 0;

}